

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ConnmanTestMsg::FlushSendBuffer(ConnmanTestMsg *this,CNode *node)

{
  long lVar1;
  bool bVar2;
  pointer pTVar3;
  size_t sVar4;
  char *in_RSI;
  AnnotatedMixin<std::mutex> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_msg_type;
  type *_more;
  type *to_send;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock15;
  Span<const_unsigned_char> *in_stack_ffffffffffffff88;
  deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffc8,in_RDI,in_RSI,in_stack_ffffffffffffffb0,
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x18,0));
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::clear
            (in_stack_ffffffffffffff98);
  in_RSI[0x20] = '\0';
  in_RSI[0x21] = '\0';
  in_RSI[0x22] = '\0';
  in_RSI[0x23] = '\0';
  in_RSI[0x24] = '\0';
  in_RSI[0x25] = '\0';
  in_RSI[0x26] = '\0';
  in_RSI[0x27] = '\0';
  while( true ) {
    pTVar3 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                       ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                        in_stack_ffffffffffffff88);
    (*pTVar3->_vptr_Transport[7])(&stack0xffffffffffffffc8,pTVar3,0);
    std::get<0ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffff88);
    std::get<1ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffff88);
    std::get<2ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffff88);
    bVar2 = Span<const_unsigned_char>::empty(in_stack_ffffffffffffff88);
    if (bVar2) break;
    pTVar3 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                       ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                        in_stack_ffffffffffffff88);
    sVar4 = Span<const_unsigned_char>::size(in_stack_ffffffffffffff88);
    (*pTVar3->_vptr_Transport[8])(pTVar3,sVar4);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ConnmanTestMsg::FlushSendBuffer(CNode& node) const
{
    LOCK(node.cs_vSend);
    node.vSendMsg.clear();
    node.m_send_memusage = 0;
    while (true) {
        const auto& [to_send, _more, _msg_type] = node.m_transport->GetBytesToSend(false);
        if (to_send.empty()) break;
        node.m_transport->MarkBytesSent(to_send.size());
    }
}